

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O2

bool __thiscall
cmGraphVizWriter::GenerateForTargetType(cmGraphVizWriter *this,TargetType targetType)

{
  switch(targetType) {
  case EXECUTABLE:
    return this->GenerateForExecutables;
  case STATIC_LIBRARY:
    return this->GenerateForStaticLibs;
  case SHARED_LIBRARY:
    return this->GenerateForSharedLibs;
  case MODULE_LIBRARY:
    return this->GenerateForModuleLibs;
  default:
    return false;
  }
}

Assistant:

bool cmGraphVizWriter::GenerateForTargetType(cmState::TargetType targetType)
                                                                          const
{
  switch (targetType)
  {
    case cmState::EXECUTABLE:
      return this->GenerateForExecutables;
    case cmState::STATIC_LIBRARY:
      return this->GenerateForStaticLibs;
    case cmState::SHARED_LIBRARY:
      return this->GenerateForSharedLibs;
    case cmState::MODULE_LIBRARY:
      return this->GenerateForModuleLibs;
    default:
      break;
  }
  return false;
}